

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texture_size_invalid_sampler
               (NegativeTestContext *ctx)

{
  DataType dataType;
  bool bVar1;
  ContextType CVar2;
  char *pcVar3;
  ostream *poVar4;
  ShaderType SVar5;
  DataType dataType_00;
  DataType dataType_01;
  long lVar6;
  uint uVar7;
  allocator<char> local_2b5;
  ShaderType local_2b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  long local_290;
  string local_288;
  string local_268;
  string shaderSource;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  ostringstream source;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&source,
             "textureSize: Invalid sampler type - some overloads take two arguments while others take only one."
             ,(allocator<char> *)&local_2b0);
  NegativeTestContext::beginSection(ctx,(string *)&source);
  std::__cxx11::string::~string((string *)&source);
  lVar6 = 0;
  do {
    if (lVar6 == 6) {
      NegativeTestContext::endSection(ctx);
      return;
    }
    SVar5 = (&NegativeTestShared::(anonymous_namespace)::s_shaders)[lVar6];
    bVar1 = NegativeTestContext::isShaderSupported(ctx,SVar5);
    if (bVar1) {
      local_2b4 = SVar5;
      pcVar3 = glu::getShaderTypeName(SVar5);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b0,pcVar3,(allocator<char> *)&local_268);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&source,
                     "Verify shader: ",&local_2b0);
      local_290 = lVar6;
      NegativeTestContext::beginSection
                (ctx,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&source);
      std::__cxx11::string::~string((string *)&source);
      std::__cxx11::string::~string((string *)&local_2b0);
      for (lVar6 = 0; lVar6 != 0x70; lVar6 = lVar6 + 4) {
        CVar2.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
        bVar1 = glu::contextSupports(CVar2,(ApiType)0x23);
        SVar5 = 0x18ca630;
        dataType = *(DataType *)
                    ((long)&NegativeTestShared::(anonymous_namespace)::s_samplerTypes + lVar6);
        if (bVar1) {
LAB_013594a4:
          pcVar3 = glu::getDataTypeName(dataType);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2b0,pcVar3,(allocator<char> *)&local_268);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &source,"Verify sampler data type: ",&local_2b0);
          NegativeTestContext::beginSection
                    (ctx,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &source);
          std::__cxx11::string::~string((string *)&source);
          std::__cxx11::string::~string((string *)&local_2b0);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&source);
          CVar2.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
          bVar1 = glu::contextSupports(CVar2,(ApiType)0x23);
          pcVar3 = glu::getGLSLVersionDeclaration(bVar1 | GLSL_VERSION_310_ES);
          poVar4 = std::operator<<(&source.super_basic_ostream<char,_std::char_traits<char>_>,pcVar3
                                  );
          poVar4 = std::operator<<(poVar4,"\n");
          NegativeTestShared::(anonymous_namespace)::getDataTypeExtension_abi_cxx11_
                    (&local_268,(_anonymous_namespace_ *)(ulong)dataType,dataType_01);
          getShaderExtensionDeclaration(&local_2b0,&local_268);
          poVar4 = std::operator<<(poVar4,(string *)&local_2b0);
          NegativeTestShared::(anonymous_namespace)::getShaderInitialization_abi_cxx11_
                    (&local_288,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)local_2b4
                     ,SVar5);
          poVar4 = std::operator<<(poVar4,(string *)&local_288);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_208,"sampler",&local_2b5);
          declareShaderUniform(&local_228,dataType,&local_208);
          poVar4 = std::operator<<(poVar4,(string *)&local_228);
          poVar4 = std::operator<<(poVar4,"void main(void)\n");
          std::operator<<(poVar4,"{\n");
          std::__cxx11::string::~string((string *)&local_228);
          std::__cxx11::string::~string((string *)&local_208);
          std::__cxx11::string::~string((string *)&local_288);
          std::__cxx11::string::~string((string *)&local_2b0);
          std::__cxx11::string::~string((string *)&local_268);
          uVar7 = dataType - TYPE_SAMPLER_2D;
          if (uVar7 < 0x33) {
            if ((0x3b76dbbUL >> ((ulong)uVar7 & 0x3f) & 1) == 0) {
              if ((0x7e0001c000000U >> ((ulong)uVar7 & 0x3f) & 1) != 0) {
                poVar4 = std::operator<<(&source.super_basic_ostream<char,_std::char_traits<char>_>,
                                         "    ");
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_288,"lod",(allocator<char> *)&local_228);
                declareAndInitializeShaderVariable(&local_2b0,TYPE_INT,&local_288);
                poVar4 = std::operator<<(poVar4,(string *)&local_2b0);
                std::operator<<(poVar4,"    textureSize(sampler, lod);\n");
                std::__cxx11::string::~string((string *)&local_2b0);
                std::__cxx11::string::~string((string *)&local_288);
              }
            }
            else {
              std::operator<<(&source.super_basic_ostream<char,_std::char_traits<char>_>,
                              "    textureSize(sampler);\n");
            }
          }
          std::operator<<(&source.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&source);
          std::__cxx11::string::string((string *)&local_1e8,(string *)&shaderSource);
          verifyShader(ctx,local_2b4,&local_1e8);
          std::__cxx11::string::~string((string *)&local_1e8);
          NegativeTestContext::endSection(ctx);
          std::__cxx11::string::~string((string *)&shaderSource);
        }
        else {
          SVar5 = 0x18ca630;
          NegativeTestShared::(anonymous_namespace)::getDataTypeExtension_abi_cxx11_
                    (&local_1c8,(_anonymous_namespace_ *)(ulong)dataType,dataType_00);
          bVar1 = NegativeTestContext::isExtensionSupported(ctx,&local_1c8);
          std::__cxx11::string::~string((string *)&local_1c8);
          if (bVar1) goto LAB_013594a4;
        }
      }
      NegativeTestContext::endSection(ctx);
      lVar6 = local_290;
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

void texture_size_invalid_sampler (NegativeTestContext& ctx)
{
	ctx.beginSection("textureSize: Invalid sampler type - some overloads take two arguments while others take only one.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_samplerTypes); ++dataTypeNdx)
			{
				if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(getDataTypeExtension(s_samplerTypes[dataTypeNdx])))
				{
					ctx.beginSection("Verify sampler data type: " + std::string(getDataTypeName(s_samplerTypes[dataTypeNdx])));
					const std::string shaderSource(genShaderSourceTextureSize_sampler(ctx, s_shaders[shaderNdx], s_samplerTypes[dataTypeNdx], glu::TYPE_INT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					ctx.endSection();
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}